

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::Synth::playSysexWithoutHeader
          (Synth *this,Bit8u device,Bit8u command,Bit8u *sysex,Bit32u len)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *fmt;
  uint len_00;
  
  if (device < 0x11) {
    if (len < 2) {
      fmt = "playSysexWithoutHeader: Message is too short (%d bytes)!";
      uVar3 = (ulong)len;
    }
    else {
      len_00 = len - 1;
      bVar1 = calcSysexChecksum(sysex,len_00,'\0');
      if (bVar1 != sysex[len_00]) {
        printDebug(this,
                   "playSysexWithoutHeader: Message checksum is incorrect (provided: %02x, expected: %02x)!"
                   ,(ulong)sysex[len_00],(ulong)bVar1);
        if (this->opened != true) {
          return;
        }
        Display::checksumErrorOccurred(this->extensions->display);
        return;
      }
      uVar3 = (ulong)command;
      switch(command) {
      case '@':
      case 'E':
        return;
      case 'A':
        bVar2 = hasActivePartials(this);
        if (!bVar2) {
          return;
        }
        printDebug(this,
                   "playSysexWithoutHeader: Got SYSEX_CMD_RQD but partials are active - ignoring");
        return;
      case 'B':
switchD_0015e325_caseD_42:
        writeSysex(this,device,sysex,len_00);
        return;
      case 'C':
      case 'D':
        goto switchD_0015e325_caseD_43;
      default:
        if (command == '\x11') {
          return;
        }
        if (command == '\x12') goto switchD_0015e325_caseD_42;
switchD_0015e325_caseD_43:
        fmt = "playSysexWithoutHeader: Unsupported command %02x";
      }
    }
  }
  else {
    uVar3 = (ulong)device;
    fmt = 
    "playSysexWithoutHeader: Message is not intended for this device ID (provided: %02x, expected: 0x10 or channel)"
    ;
  }
  printDebug(this,fmt,uVar3);
  return;
}

Assistant:

void Synth::playSysexWithoutHeader(Bit8u device, Bit8u command, const Bit8u *sysex, Bit32u len) {
	if (device > 0x10) {
		// We have device ID 0x10 (default, but changeable, on real MT-32), < 0x10 is for channels
		printDebug("playSysexWithoutHeader: Message is not intended for this device ID (provided: %02x, expected: 0x10 or channel)", int(device));
		return;
	}

	// All models process the checksum before anything else and ignore messages lacking the checksum, or containing the checksum only.
	if (len < 2) {
		printDebug("playSysexWithoutHeader: Message is too short (%d bytes)!", len);
		return;
	}
	Bit8u checksum = calcSysexChecksum(sysex, len - 1);
	if (checksum != sysex[len - 1]) {
		printDebug("playSysexWithoutHeader: Message checksum is incorrect (provided: %02x, expected: %02x)!", sysex[len - 1], checksum);
		if (opened) extensions.display->checksumErrorOccurred();
		return;
	}
	len -= 1; // Exclude checksum

	if (command == SYSEX_CMD_EOD) {
#if MT32EMU_MONITOR_SYSEX > 0
		printDebug("playSysexWithoutHeader: Ignored unsupported command %02x", command);
#endif
		return;
	}
	switch (command) {
	case SYSEX_CMD_WSD:
#if MT32EMU_MONITOR_SYSEX > 0
		printDebug("playSysexWithoutHeader: Ignored unsupported command %02x", command);
#endif
		break;
	case SYSEX_CMD_DAT:
		/* Outcommented until we (ever) actually implement handshake communication
		if (hasActivePartials()) {
			printDebug("playSysexWithoutHeader: Got SYSEX_CMD_DAT but partials are active - ignoring");
			// FIXME: We should send SYSEX_CMD_RJC in this case
			break;
		}
		*/
		// Fall-through
	case SYSEX_CMD_DT1:
		writeSysex(device, sysex, len);
		break;
	case SYSEX_CMD_RQD:
		if (hasActivePartials()) {
			printDebug("playSysexWithoutHeader: Got SYSEX_CMD_RQD but partials are active - ignoring");
			// FIXME: We should send SYSEX_CMD_RJC in this case
			break;
		}
		// Fall-through
	case SYSEX_CMD_RQ1:
		readSysex(device, sysex, len);
		break;
	default:
		printDebug("playSysexWithoutHeader: Unsupported command %02x", command);
		return;
	}
}